

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O3

uint __thiscall
llvm::DWARFVerifier::verifyAppleAccelTable
          (DWARFVerifier *this,DWARFSection *AccelSection,DataExtractor *StrData,char *SectionName)

{
  DWARFObject *pDVar1;
  bool bVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint uVar8;
  raw_ostream *prVar9;
  ulong uVar10;
  char *pcVar11;
  size_t __n;
  Error *E;
  void *__buf;
  DWARFDebugInfoEntry *pDVar12;
  size_t sVar13;
  undefined1 in_R8B;
  DWARFSection *pDVar14;
  unsigned_long N;
  uint uVar15;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  StringRef Str_04;
  StringRef Str_05;
  ArrayRef<std::pair<unsigned_short,_llvm::dwarf::Form>_> AVar16;
  pair<unsigned_long,_llvm::dwarf::Tag> pVar17;
  DWARFDie DVar18;
  StringRef SVar19;
  AppleAcceleratorTable local_1d0;
  uint64_t local_140;
  uint64_t HashOffset;
  uint64_t DataOffset;
  uint64_t StringOffset;
  DataExtractor *local_120;
  undefined **local_118;
  _func_int **local_110;
  long local_108;
  ulong local_100;
  undefined **local_f8;
  ulong local_f0;
  ulong local_e8;
  char *local_e0;
  string local_d8;
  undefined4 local_b8;
  ulong local_b0;
  int local_a8;
  uint32_t local_a4;
  int local_a0;
  uint local_9c;
  char *local_98;
  undefined1 auStack_90 [8];
  DWARFDataExtractor AccelSectionData;
  char *local_58;
  uint64_t HashDataOffset;
  DWARFSection *local_48;
  uint64_t BucketsOffset;
  ulong local_38;
  
  pDVar1 = (this->DCtx->DObj)._M_t.
           super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
           .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
  local_e0 = SectionName;
  iVar3 = (*pDVar1->_vptr_DWARFObject[5])(pDVar1);
  local_1d0.super_DWARFAcceleratorTable.AccelSection.super_DataExtractor.Data.Data =
       (AccelSection->Data).Data;
  local_1d0.super_DWARFAcceleratorTable.AccelSection.super_DataExtractor.Data.Length =
       (AccelSection->Data).Length;
  local_1d0.super_DWARFAcceleratorTable.AccelSection.super_DataExtractor.IsLittleEndian =
       (uint8_t)iVar3;
  AccelSectionData.super_DataExtractor.Data.Length._1_1_ = 0;
  local_1d0.super_DWARFAcceleratorTable.StringSection.IsLittleEndian = StrData->IsLittleEndian;
  local_1d0.super_DWARFAcceleratorTable.StringSection.AddressSize = StrData->AddressSize;
  local_1d0.super_DWARFAcceleratorTable.StringSection._18_6_ = *(undefined6 *)&StrData->field_0x12;
  local_1d0.HdrData.Atoms.super_SmallVectorImpl<std::pair<unsigned_short,_llvm::dwarf::Form>_>.
  super_SmallVectorTemplateBase<std::pair<unsigned_short,_llvm::dwarf::Form>,_false>.
  super_SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>.
  super_SmallVectorBase.BeginX =
       &local_1d0.HdrData.Atoms.
        super_SmallVectorStorage<std::pair<unsigned_short,_llvm::dwarf::Form>,_3U>;
  local_1d0.super_DWARFAcceleratorTable.StringSection.Data.Data = (StrData->Data).Data;
  local_1d0.super_DWARFAcceleratorTable.StringSection.Data.Length = (StrData->Data).Length;
  local_1d0.super_DWARFAcceleratorTable.AccelSection.super_DataExtractor.AddressSize = '\0';
  local_1d0.super_DWARFAcceleratorTable.AccelSection.super_DataExtractor._18_4_ =
       AccelSectionData.super_DataExtractor.Data.Length._2_4_;
  local_1d0.super_DWARFAcceleratorTable.AccelSection.super_DataExtractor._22_2_ =
       AccelSectionData.super_DataExtractor.Data.Length._6_2_;
  local_110 = (_func_int **)&PTR__AppleAcceleratorTable_00d77728;
  local_1d0.super_DWARFAcceleratorTable._vptr_DWARFAcceleratorTable =
       (_func_int **)&PTR__AppleAcceleratorTable_00d77728;
  local_1d0.HdrData.Atoms.super_SmallVectorImpl<std::pair<unsigned_short,_llvm::dwarf::Form>_>.
  super_SmallVectorTemplateBase<std::pair<unsigned_short,_llvm::dwarf::Form>,_false>.
  super_SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>.
  super_SmallVectorBase.Size = 0;
  local_1d0.HdrData.Atoms.super_SmallVectorImpl<std::pair<unsigned_short,_llvm::dwarf::Form>_>.
  super_SmallVectorTemplateBase<std::pair<unsigned_short,_llvm::dwarf::Form>,_false>.
  super_SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>.
  super_SmallVectorBase.Capacity = 3;
  local_1d0.IsValid = false;
  SVar19.Length = 10;
  SVar19.Data = "Verifying ";
  local_1d0.super_DWARFAcceleratorTable.AccelSection.Obj = pDVar1;
  local_1d0.super_DWARFAcceleratorTable.AccelSection.Section = AccelSection;
  local_120 = StrData;
  auStack_90 = (undefined1  [8])
               local_1d0.super_DWARFAcceleratorTable.AccelSection.super_DataExtractor.Data.Data;
  AccelSectionData.super_DataExtractor.Data.Data =
       (char *)local_1d0.super_DWARFAcceleratorTable.AccelSection.super_DataExtractor.Data.Length;
  AccelSectionData.super_DataExtractor.Data.Length._0_1_ =
       local_1d0.super_DWARFAcceleratorTable.AccelSection.super_DataExtractor.IsLittleEndian;
  AccelSectionData.super_DataExtractor._16_8_ = pDVar1;
  AccelSectionData.Obj = (DWARFObject *)AccelSection;
  BucketsOffset = (uint64_t)this;
  prVar9 = raw_ostream::operator<<(this->OS,SVar19);
  prVar9 = raw_ostream::operator<<(prVar9,local_e0);
  Str.Length = 4;
  Str.Data = "...\n";
  raw_ostream::operator<<(prVar9,Str);
  uVar4 = AppleAcceleratorTable::getSizeHdr(&local_1d0);
  if ((char *)(ulong)uVar4 < AccelSectionData.super_DataExtractor.Data.Data) {
    AppleAcceleratorTable::extract((AppleAcceleratorTable *)&stack0xffffffffffffffb8);
    uVar10 = (ulong)local_48 & 0xfffffffffffffffe;
    local_48 = (DWARFSection *)(uVar10 != 0 | uVar10);
    if (uVar10 == 0) {
      uVar4 = AppleAcceleratorTable::getNumBuckets(&local_1d0);
      uVar5 = AppleAcceleratorTable::getNumHashes(&local_1d0);
      uVar6 = AppleAcceleratorTable::getSizeHdr(&local_1d0);
      uVar7 = AppleAcceleratorTable::getHeaderDataLength(&local_1d0);
      AccelSectionData.Section = (DWARFSection *)(ulong)(uVar7 + uVar6);
      local_48 = AccelSectionData.Section;
      if (uVar4 == 0) {
        local_38 = 0;
      }
      else {
        local_38 = 0;
        uVar6 = 0;
        do {
          uVar7 = DataExtractor::getU32
                            ((DataExtractor *)auStack_90,(uint64_t *)&stack0xffffffffffffffb8,
                             (Error *)0x0);
          if (uVar7 != 0xffffffff && uVar5 <= uVar7) {
            prVar9 = WithColor::error(*(WithColor **)BucketsOffset,(raw_ostream *)0xbd4a1c,
                                      (StringRef)ZEXT816(0),(bool)in_R8B);
            local_d8._M_string_length = 0xbcf57d;
            local_d8._M_dataplus._M_p = (pointer)&PTR_home_00d78270;
            local_d8.field_2._M_allocated_capacity._4_4_ = uVar6;
            local_d8.field_2._M_allocated_capacity._0_4_ = uVar7;
            raw_ostream::operator<<(prVar9,(format_object_base *)&local_d8);
            local_38 = (ulong)((int)local_38 + 1);
          }
          uVar6 = uVar6 + 1;
        } while (uVar4 != uVar6);
      }
      AVar16 = AppleAcceleratorTable::getAtomsDesc(&local_1d0);
      pDVar14 = AccelSectionData.Section;
      if ((int)AVar16.Length == 0) {
        prVar9 = WithColor::error(*(WithColor **)BucketsOffset,(raw_ostream *)0xbd4a1c,
                                  (StringRef)ZEXT816(0),(bool)in_R8B);
        sVar13 = 0x23;
        pcVar11 = "No atoms: failed to read HashData.\n";
      }
      else {
        bVar2 = AppleAcceleratorTable::validateForms(&local_1d0);
        if (bVar2) {
          if (uVar5 != 0) {
            pDVar14 = (DWARFSection *)((long)&(pDVar14->Data).Data + (ulong)(uVar4 * 4));
            local_108 = (long)&(pDVar14->Data).Data + (ulong)(uVar5 * 4);
            local_100 = (ulong)uVar5;
            uVar10 = 0;
            local_118 = &PTR_home_00d78428;
            local_f8 = &PTR_home_00d778b8;
            AccelSectionData.Section = pDVar14;
            do {
              iVar3 = (int)uVar10;
              local_140 = (long)&(pDVar14->Data).Data + (ulong)(uint)(iVar3 * 4);
              HashOffset = (ulong)(uint)(iVar3 * 4) + local_108;
              HashDataOffset._0_4_ =
                   DataExtractor::getU32((DataExtractor *)auStack_90,&local_140,(Error *)0x0);
              uVar5 = DataExtractor::getU32((DataExtractor *)auStack_90,&HashOffset,(Error *)0x0);
              local_58 = (char *)(ulong)uVar5;
              if (AccelSectionData.super_DataExtractor.Data.Data <= local_58 + 7) {
                prVar9 = WithColor::error(*(WithColor **)BucketsOffset,(raw_ostream *)0xbd4a1c,
                                          (StringRef)ZEXT816(0),(bool)in_R8B);
                local_d8._M_string_length = 0xbcf5f5;
                local_d8._M_dataplus._M_p = (pointer)local_f8;
                local_d8.field_2._M_allocated_capacity = (size_type)local_58;
                local_d8.field_2._8_4_ = iVar3;
                raw_ostream::operator<<(prVar9,(format_object_base *)&local_d8);
                local_38 = (ulong)((int)local_38 + 1);
              }
              HashDataOffset._4_4_ = 0;
              while (uVar5 = DataExtractor::getU32
                                       ((DataExtractor *)auStack_90,(uint64_t *)&local_58,
                                        (Error *)0x0), uVar5 != 0) {
                uVar6 = DataExtractor::getU32
                                  ((DataExtractor *)auStack_90,(uint64_t *)&local_58,(Error *)0x0);
                if (uVar6 != 0) {
                  local_e8 = (ulong)uVar5;
                  StringOffset = (uint64_t)uVar6;
                  N = 0;
                  do {
                    pVar17 = AppleAcceleratorTable::readAtoms(&local_1d0,(uint64_t *)&local_58);
                    DVar18 = DWARFContext::getDIEForOffset
                                       (*(DWARFContext **)(BucketsOffset + 8),pVar17.first);
                    pDVar12 = DVar18.Die;
                    if (DVar18.U == (DWARFUnit *)0x0 || pDVar12 == (DWARFDebugInfoEntry *)0x0) {
                      if (uVar4 == 0) {
                        uVar15 = 0xffffffff;
                      }
                      else {
                        uVar15 = (uint32_t)HashDataOffset % uVar4;
                      }
                      DataOffset = local_e8;
                      pcVar11 = DataExtractor::getCStr(local_120,&DataOffset);
                      prVar9 = WithColor::error(*(WithColor **)BucketsOffset,(raw_ostream *)0xbd4a1c
                                                ,(StringRef)ZEXT816(0),(bool)in_R8B);
                      if (pcVar11 == (char *)0x0) {
                        pcVar11 = "<NULL>";
                      }
                      local_d8._M_string_length = 0xbcf62c;
                      local_d8._M_dataplus._M_p = (pointer)local_118;
                      local_b8 = (undefined4)N;
                      local_b0 = local_e8;
                      local_a8 = HashDataOffset._4_4_;
                      local_a4 = (uint32_t)HashDataOffset;
                      local_98 = local_e0;
                      local_d8.field_2._M_allocated_capacity = (size_type)pcVar11;
                      local_d8.field_2._8_8_ = pVar17.first;
                      local_a0 = iVar3;
                      local_9c = uVar15;
                      raw_ostream::operator<<(prVar9,(format_object_base *)&local_d8);
LAB_00b0cecf:
                      local_38 = (ulong)((int)local_38 + 1);
                    }
                    else {
                      uVar15 = pVar17._8_4_ & 0xffff;
                      if (((undefined1  [16])pVar17 & (undefined1  [16])0xffff) !=
                          (undefined1  [16])0x0) {
                        if (pDVar12->AbbrevDecl == (DWARFAbbreviationDeclaration *)0x0) {
                          uVar8 = 0;
                        }
                        else {
                          uVar8 = (uint)pDVar12->AbbrevDecl->Tag;
                        }
                        if (uVar8 != uVar15) {
                          prVar9 = WithColor::error(*(WithColor **)BucketsOffset,
                                                    (raw_ostream *)0xbd4a1c,(StringRef)ZEXT816(0),
                                                    (bool)in_R8B);
                          Str_01.Length = 4;
                          Str_01.Data = "Tag ";
                          prVar9 = raw_ostream::operator<<(prVar9,Str_01);
                          SVar19 = dwarf::TagString(uVar15);
                          prVar9 = raw_ostream::operator<<(prVar9,SVar19);
                          Str_02.Length = 0x29;
                          Str_02.Data = " in accelerator table does not match Tag ";
                          prVar9 = raw_ostream::operator<<(prVar9,Str_02);
                          if (pDVar12->AbbrevDecl == (DWARFAbbreviationDeclaration *)0x0) {
                            uVar15 = 0;
                          }
                          else {
                            uVar15 = (uint)pDVar12->AbbrevDecl->Tag;
                          }
                          SVar19 = dwarf::TagString(uVar15);
                          prVar9 = raw_ostream::operator<<(prVar9,SVar19);
                          Str_03.Length = 8;
                          Str_03.Data = " of DIE[";
                          prVar9 = raw_ostream::operator<<(prVar9,Str_03);
                          prVar9 = raw_ostream::operator<<(prVar9,N);
                          Str_04.Length = 3;
                          Str_04.Data = "].\n";
                          raw_ostream::operator<<(prVar9,Str_04);
                          goto LAB_00b0cecf;
                        }
                      }
                    }
                    N = N + 1;
                    pDVar14 = AccelSectionData.Section;
                  } while (StringOffset != N);
                }
                HashDataOffset._4_4_ = HashDataOffset._4_4_ + 1;
              }
              uVar10 = uVar10 + 1;
            } while (uVar10 != local_100);
          }
          goto LAB_00b0cf60;
        }
        prVar9 = WithColor::error(*(WithColor **)BucketsOffset,(raw_ostream *)0xbd4a1c,
                                  (StringRef)ZEXT816(0),(bool)in_R8B);
        sVar13 = 0x2b;
        pcVar11 = "Unsupported form: failed to read HashData.\n";
      }
      local_38 = 1;
      Str_05.Length = sVar13;
      Str_05.Data = pcVar11;
      raw_ostream::operator<<(prVar9,Str_05);
    }
    else {
      __n = 0;
      prVar9 = WithColor::error(*(WithColor **)BucketsOffset,(raw_ostream *)0xbd4a1c,
                                (StringRef)ZEXT816(0),(bool)in_R8B);
      local_f0 = (ulong)local_48 | 1;
      local_48 = (DWARFSection *)0x0;
      toString_abi_cxx11_(&local_d8,(llvm *)&local_f0,E);
      prVar9 = (raw_ostream *)
               raw_ostream::write(prVar9,(int)local_d8._M_dataplus._M_p,
                                  (void *)local_d8._M_string_length,__n);
      pcVar11 = prVar9->OutBufCur;
      if (pcVar11 < prVar9->OutBufEnd) {
        prVar9->OutBufCur = pcVar11 + 1;
        *pcVar11 = '\n';
      }
      else {
        raw_ostream::write(prVar9,10,__buf,(size_t)pcVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,
                        (ulong)(local_d8.field_2._M_allocated_capacity + 1));
      }
      if ((long *)(local_f0 & 0xfffffffffffffffe) != (long *)0x0) {
        (**(code **)(*(long *)(local_f0 & 0xfffffffffffffffe) + 8))();
      }
      if ((long *)((ulong)local_48 & 0xfffffffffffffffe) != (long *)0x0) {
        (**(code **)(*(long *)((ulong)local_48 & 0xfffffffffffffffe) + 8))();
      }
      local_38 = 1;
    }
  }
  else {
    prVar9 = WithColor::error(*(WithColor **)BucketsOffset,(raw_ostream *)0xbd4a1c,
                              (StringRef)ZEXT816(0),(bool)in_R8B);
    local_38 = 1;
    Str_00.Length = 0x2e;
    Str_00.Data = "Section is too small to fit a section header.\n";
    raw_ostream::operator<<(prVar9,Str_00);
  }
LAB_00b0cf60:
  local_1d0.super_DWARFAcceleratorTable._vptr_DWARFAcceleratorTable = local_110;
  if ((SmallVectorStorage<std::pair<unsigned_short,_llvm::dwarf::Form>,_3U> *)
      local_1d0.HdrData.Atoms.super_SmallVectorImpl<std::pair<unsigned_short,_llvm::dwarf::Form>_>.
      super_SmallVectorTemplateBase<std::pair<unsigned_short,_llvm::dwarf::Form>,_false>.
      super_SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>.
      super_SmallVectorBase.BeginX !=
      &local_1d0.HdrData.Atoms.
       super_SmallVectorStorage<std::pair<unsigned_short,_llvm::dwarf::Form>,_3U>) {
    free(local_1d0.HdrData.Atoms.
         super_SmallVectorImpl<std::pair<unsigned_short,_llvm::dwarf::Form>_>.
         super_SmallVectorTemplateBase<std::pair<unsigned_short,_llvm::dwarf::Form>,_false>.
         super_SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>.
         super_SmallVectorBase.BeginX);
  }
  DWARFAcceleratorTable::~DWARFAcceleratorTable(&local_1d0.super_DWARFAcceleratorTable);
  return (uint)local_38;
}

Assistant:

unsigned DWARFVerifier::verifyAppleAccelTable(const DWARFSection *AccelSection,
                                              DataExtractor *StrData,
                                              const char *SectionName) {
  unsigned NumErrors = 0;
  DWARFDataExtractor AccelSectionData(DCtx.getDWARFObj(), *AccelSection,
                                      DCtx.isLittleEndian(), 0);
  AppleAcceleratorTable AccelTable(AccelSectionData, *StrData);

  OS << "Verifying " << SectionName << "...\n";

  // Verify that the fixed part of the header is not too short.
  if (!AccelSectionData.isValidOffset(AccelTable.getSizeHdr())) {
    error() << "Section is too small to fit a section header.\n";
    return 1;
  }

  // Verify that the section is not too short.
  if (Error E = AccelTable.extract()) {
    error() << toString(std::move(E)) << '\n';
    return 1;
  }

  // Verify that all buckets have a valid hash index or are empty.
  uint32_t NumBuckets = AccelTable.getNumBuckets();
  uint32_t NumHashes = AccelTable.getNumHashes();

  uint64_t BucketsOffset =
      AccelTable.getSizeHdr() + AccelTable.getHeaderDataLength();
  uint64_t HashesBase = BucketsOffset + NumBuckets * 4;
  uint64_t OffsetsBase = HashesBase + NumHashes * 4;
  for (uint32_t BucketIdx = 0; BucketIdx < NumBuckets; ++BucketIdx) {
    uint32_t HashIdx = AccelSectionData.getU32(&BucketsOffset);
    if (HashIdx >= NumHashes && HashIdx != UINT32_MAX) {
      error() << format("Bucket[%d] has invalid hash index: %u.\n", BucketIdx,
                        HashIdx);
      ++NumErrors;
    }
  }
  uint32_t NumAtoms = AccelTable.getAtomsDesc().size();
  if (NumAtoms == 0) {
    error() << "No atoms: failed to read HashData.\n";
    return 1;
  }
  if (!AccelTable.validateForms()) {
    error() << "Unsupported form: failed to read HashData.\n";
    return 1;
  }

  for (uint32_t HashIdx = 0; HashIdx < NumHashes; ++HashIdx) {
    uint64_t HashOffset = HashesBase + 4 * HashIdx;
    uint64_t DataOffset = OffsetsBase + 4 * HashIdx;
    uint32_t Hash = AccelSectionData.getU32(&HashOffset);
    uint64_t HashDataOffset = AccelSectionData.getU32(&DataOffset);
    if (!AccelSectionData.isValidOffsetForDataOfSize(HashDataOffset,
                                                     sizeof(uint64_t))) {
      error() << format("Hash[%d] has invalid HashData offset: "
                        "0x%08" PRIx64 ".\n",
                        HashIdx, HashDataOffset);
      ++NumErrors;
    }

    uint64_t StrpOffset;
    uint64_t StringOffset;
    uint32_t StringCount = 0;
    uint64_t Offset;
    unsigned Tag;
    while ((StrpOffset = AccelSectionData.getU32(&HashDataOffset)) != 0) {
      const uint32_t NumHashDataObjects =
          AccelSectionData.getU32(&HashDataOffset);
      for (uint32_t HashDataIdx = 0; HashDataIdx < NumHashDataObjects;
           ++HashDataIdx) {
        std::tie(Offset, Tag) = AccelTable.readAtoms(&HashDataOffset);
        auto Die = DCtx.getDIEForOffset(Offset);
        if (!Die) {
          const uint32_t BucketIdx =
              NumBuckets ? (Hash % NumBuckets) : UINT32_MAX;
          StringOffset = StrpOffset;
          const char *Name = StrData->getCStr(&StringOffset);
          if (!Name)
            Name = "<NULL>";

          error() << format(
              "%s Bucket[%d] Hash[%d] = 0x%08x "
              "Str[%u] = 0x%08" PRIx64 " DIE[%d] = 0x%08" PRIx64 " "
              "is not a valid DIE offset for \"%s\".\n",
              SectionName, BucketIdx, HashIdx, Hash, StringCount, StrpOffset,
              HashDataIdx, Offset, Name);

          ++NumErrors;
          continue;
        }
        if ((Tag != dwarf::DW_TAG_null) && (Die.getTag() != Tag)) {
          error() << "Tag " << dwarf::TagString(Tag)
                  << " in accelerator table does not match Tag "
                  << dwarf::TagString(Die.getTag()) << " of DIE[" << HashDataIdx
                  << "].\n";
          ++NumErrors;
        }
      }
      ++StringCount;
    }
  }
  return NumErrors;
}